

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

void __thiscall
embree::Geometry::setIntersectionFilterFunctionN(Geometry *this,RTCFilterFunctionN filter)

{
  undefined8 *puVar1;
  allocator local_39;
  string local_38 [32];
  
  if ((0x2ef7777fU >> ((uint)this->field_8 & 0x1f) & 1) != 0) {
    this->intersectionFilterN = filter;
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            (local_38,"filter functions not supported for this geometry",&local_39);
  *puVar1 = &PTR__rtcore_error_002496e8;
  *(undefined4 *)(puVar1 + 1) = 3;
  std::__cxx11::string::string((string *)(puVar1 + 2),local_38);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

void Geometry::setIntersectionFilterFunctionN (RTCFilterFunctionN filter) 
  {
    if (!(getTypeMask() & (MTY_TRIANGLE_MESH | MTY_QUAD_MESH | MTY_CURVES | MTY_SUBDIV_MESH | MTY_USER_GEOMETRY | MTY_GRID_MESH)))
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"filter functions not supported for this geometry"); 

    intersectionFilterN = filter;
  }